

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

size_t ggml_get_max_tensor_size(ggml_context *ctx)

{
  ggml_tensor *in_RDI;
  size_t bytes;
  ggml_tensor *tensor;
  size_t max_size;
  size_t local_28;
  ggml_tensor *local_18;
  ulong local_10;
  
  local_10 = 0;
  for (local_18 = ggml_get_first_tensor((ggml_context *)in_RDI); local_18 != (ggml_tensor *)0x0;
      local_18 = ggml_get_next_tensor((ggml_context *)in_RDI,local_18)) {
    local_28 = ggml_nbytes(in_RDI);
    if (local_28 < local_10) {
      local_28 = local_10;
    }
    local_10 = local_28;
  }
  return local_10;
}

Assistant:

size_t ggml_get_max_tensor_size(const struct ggml_context * ctx) {
    size_t max_size = 0;

    for (struct ggml_tensor * tensor = ggml_get_first_tensor(ctx); tensor != NULL; tensor = ggml_get_next_tensor(ctx, tensor)) {
        size_t bytes = ggml_nbytes(tensor);
        max_size = MAX(max_size, bytes);
    }

    return max_size;
}